

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramActiveUniformBlocksCase::test
          (ProgramActiveUniformBlocksCase *this)

{
  uint uVar1;
  TestContext *pTVar2;
  GLsizei GVar3;
  GLuint GVar4;
  GLuint GVar5;
  int iVar6;
  qpTestResult qVar7;
  GLint GVar8;
  uint (*pauVar9) [3];
  int (*paiVar10) [3];
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  int *piVar13;
  int (*paiVar14) [2];
  CallLogWrapper *this_00;
  allocator<char> local_c89;
  string local_c88 [39];
  allocator<char> local_c61;
  string local_c60 [36];
  GLsizei local_c3c;
  GLchar local_c38 [4];
  GLint written;
  char buffer [2048];
  MessageBuilder local_430;
  undefined1 local_2b0 [8];
  StateQueryMemoryWriteGuard<int[2]> longlongUniformBlockUniformIndices;
  StateQueryMemoryWriteGuard<int> longlongUniformBlockUniforms;
  allocator<char> local_261;
  string local_260 [32];
  MessageBuilder local_240;
  undefined1 local_c0 [8];
  StateQueryMemoryWriteGuard<int[3]> uniformsBlockIndices;
  StateQueryMemoryWriteGuard<unsigned_int[3]> uniformIndices;
  char *uniformNames [3];
  GLuint local_58;
  GLint shortUniformBlockIndex;
  GLint longlongUniformBlockIndex;
  allocator<char> local_41;
  string local_40 [36];
  GLuint local_1c;
  GLuint local_18;
  GLuint program;
  GLuint shaderFrag;
  GLuint shaderVert;
  ProgramActiveUniformBlocksCase *this_local;
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  _shaderFrag = this;
  program = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  local_18 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,program,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,local_18,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,program);
  glu::CallLogWrapper::glCompileShader(this_00,local_18);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_1c = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,local_1c,program);
  glu::CallLogWrapper::glAttachShader(this_00,local_1c,local_18);
  glu::CallLogWrapper::glLinkProgram(this_00,local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    this_00,program,0x8b81,1);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    this_00,local_18,0x8b81,1);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,local_1c,0x8b82,1);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,local_1c,0x8a36,2);
  GVar4 = local_1c;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"longlongUniformBlockName",&local_41);
  iVar6 = std::__cxx11::string::length();
  verifyProgramParam(pTVar2,this_00,GVar4,0x8a35,iVar6 + 1);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_58 = glu::CallLogWrapper::glGetUniformBlockIndex
                       (&(this->super_ApiCase).super_CallLogWrapper,local_1c,
                        "longlongUniformBlockName");
  uniformNames[2]._4_4_ =
       glu::CallLogWrapper::glGetUniformBlockIndex
                 (&(this->super_ApiCase).super_CallLogWrapper,local_1c,"shortUniformBlockName");
  uniformIndices.m_postguard._4_8_ = anon_var_dwarf_1514248;
  uniformNames[0] = "shortUniformBlockName.vector2";
  uniformNames[1] = "shortUniformBlockName.vector4";
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<unsigned_int[3]> *)(uniformsBlockIndices.m_postguard + 1));
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[3]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[3]> *)local_c0);
  GVar4 = local_1c;
  pauVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)(uniformsBlockIndices.m_postguard + 1));
  glu::CallLogWrapper::glGetUniformIndices
            (&(this->super_ApiCase).super_CallLogWrapper,GVar4,3,
             (GLchar **)(uniformIndices.m_postguard + 1),*pauVar9);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::verifyValidity
            ((StateQueryMemoryWriteGuard<unsigned_int[3]> *)(uniformsBlockIndices.m_postguard + 1),
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar4 = local_1c;
  pauVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)(uniformsBlockIndices.m_postguard + 1));
  paiVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
             operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_c0);
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&(this->super_ApiCase).super_CallLogWrapper,GVar4,3,*pauVar9,0x8a3a,*paiVar10);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[3]>::verifyValidity
            ((StateQueryMemoryWriteGuard<int[3]> *)local_c0,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  ApiCase::expectError(&this->super_ApiCase,0);
  paiVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
             operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_c0);
  if ((((*paiVar10)[0] != local_58) ||
      (paiVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_c0),
      (*paiVar10)[1] != uniformNames[2]._4_4_)) ||
     (paiVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_c0),
     (*paiVar10)[2] != uniformNames[2]._4_4_)) {
    pTVar11 = tcu::TestContext::getLog
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_240,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<(&local_240,(char (*) [21])"// ERROR: Expected [");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(int *)&local_58);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(int *)((long)uniformNames + 0x14));
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(int *)((long)uniformNames + 0x14));
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2c3759d);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [6])0x2b89e13);
    paiVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_c0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,*paiVar10);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
    paiVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_c0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,*paiVar10 + 1);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
    paiVar10 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_c0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,*paiVar10 + 2);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_240);
    qVar7 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar7 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got wrong uniform block index");
    }
  }
  GVar5 = local_1c;
  GVar4 = local_58;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_260,"longlongUniformBlockName",&local_261);
  iVar6 = std::__cxx11::string::length();
  verifyActiveUniformBlockParam
            (pTVar2,&(this->super_ApiCase).super_CallLogWrapper,GVar5,GVar4,0x8a41,iVar6 + 1);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  GVar5 = local_1c;
  GVar4 = uniformNames[2]._4_4_;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&longlongUniformBlockUniforms.m_postguard,"shortUniformBlockName",
             (allocator<char> *)((long)&longlongUniformBlockUniforms.m_value + 3));
  iVar6 = std::__cxx11::string::length();
  verifyActiveUniformBlockParam
            (pTVar2,&(this->super_ApiCase).super_CallLogWrapper,GVar5,GVar4,0x8a41,iVar6 + 1);
  std::__cxx11::string::~string((string *)&longlongUniformBlockUniforms.m_postguard);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&longlongUniformBlockUniforms.m_value + 3));
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,local_1c,local_58,0x8a44,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,local_1c,local_58,0x8a46,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,local_1c,uniformNames[2]._4_4_,0x8a44,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,local_1c,uniformNames[2]._4_4_,0x8a46,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,local_1c,local_58,0x8a42,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,local_1c,uniformNames[2]._4_4_,0x8a42,2);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)longlongUniformBlockUniformIndices.m_postguard);
  GVar5 = local_1c;
  GVar4 = local_58;
  piVar13 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                      ((StateQueryMemoryWriteGuard<int> *)
                       longlongUniformBlockUniformIndices.m_postguard);
  glu::CallLogWrapper::glGetActiveUniformBlockiv
            (&(this->super_ApiCase).super_CallLogWrapper,GVar5,GVar4,0x8a42,piVar13);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            ((StateQueryMemoryWriteGuard<int> *)longlongUniformBlockUniformIndices.m_postguard,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  piVar13 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                      ((StateQueryMemoryWriteGuard *)longlongUniformBlockUniformIndices.m_postguard)
  ;
  if (*piVar13 == 2) {
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int[2]> *)local_2b0);
    GVar5 = local_1c;
    GVar4 = local_58;
    paiVar14 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2b0);
    glu::CallLogWrapper::glGetActiveUniformBlockiv
              (&(this->super_ApiCase).super_CallLogWrapper,GVar5,GVar4,0x8a43,*paiVar14);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
              ((StateQueryMemoryWriteGuard<int[2]> *)local_2b0,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    paiVar14 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2b0);
    uVar1 = (*paiVar14)[0];
    pauVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)(uniformsBlockIndices.m_postguard + 1));
    if (uVar1 == (*pauVar9)[0]) {
      paiVar14 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2b0);
      uVar1 = (*paiVar14)[1];
      pauVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)(uniformsBlockIndices.m_postguard + 1));
      if (uVar1 == (*pauVar9)[1]) goto LAB_01de657d;
    }
    paiVar14 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2b0);
    uVar1 = (*paiVar14)[1];
    pauVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)(uniformsBlockIndices.m_postguard + 1));
    if (uVar1 == (*pauVar9)[0]) {
      paiVar14 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2b0);
      uVar1 = (*paiVar14)[0];
      pauVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)(uniformsBlockIndices.m_postguard + 1));
      if (uVar1 == (*pauVar9)[1]) goto LAB_01de657d;
    }
    pTVar11 = tcu::TestContext::getLog
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_430,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<(&local_430,(char (*) [21])"// ERROR: Expected {");
    pauVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)(uniformsBlockIndices.m_postguard + 1));
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,*pauVar9);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
    pauVar9 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)(uniformsBlockIndices.m_postguard + 1));
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,*pauVar9 + 1);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a1314b);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [6])0x2b8b5dc);
    paiVar14 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2b0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,*paiVar14);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a4b1eb);
    paiVar14 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2b0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,*paiVar14 + 1);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b7dedb);
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_430);
    qVar7 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar7 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got wrong uniform indices");
    }
  }
LAB_01de657d:
  memset(local_c38,0,0x800);
  local_c38[0] = 'x';
  local_c3c = 0;
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (&(this->super_ApiCase).super_CallLogWrapper,local_1c,local_58,0x800,&local_c3c,
             local_c38);
  GVar3 = local_c3c;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c60,"longlongUniformBlockName",&local_c61);
  GVar8 = std::__cxx11::string::length();
  checkIntEquals(pTVar2,GVar3,GVar8);
  std::__cxx11::string::~string(local_c60);
  std::allocator<char>::~allocator(&local_c61);
  local_c3c = 0;
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (&(this->super_ApiCase).super_CallLogWrapper,local_1c,uniformNames[2]._4_4_,0x800,
             &local_c3c,local_c38);
  GVar3 = local_c3c;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c88,"shortUniformBlockName",&local_c89);
  GVar8 = std::__cxx11::string::length();
  checkIntEquals(pTVar2,GVar3,GVar8);
  std::__cxx11::string::~string(local_c88);
  std::allocator<char>::~allocator(&local_c89);
  local_c3c = 0;
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (&(this->super_ApiCase).super_CallLogWrapper,local_1c,local_58,1,&local_c3c,local_c38);
  checkIntEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 local_c3c,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,local_18);
  glu::CallLogWrapper::glDeleteProgram(&(this->super_ApiCase).super_CallLogWrapper,local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		static const char* testVertSource =
			"#version 300 es\n"
			"uniform longlongUniformBlockName {highp vec2 vector2;} longlongUniformInstanceName;\n"
			"uniform shortUniformBlockName {highp vec2 vector2;highp vec4 vector4;} shortUniformInstanceName;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = shortUniformInstanceName.vector4 + vec4(longlongUniformInstanceName.vector2.x) + vec4(shortUniformInstanceName.vector2.x);\n"
			"}\n\0";
		static const char* testFragSource =
			"#version 300 es\n"
			"uniform longlongUniformBlockName {highp vec2 vector2;} longlongUniformInstanceName;\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(longlongUniformInstanceName.vector2.y);\n"
			"}\n\0";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		verifyShaderParam	(m_testCtx, *this, shaderVert,	GL_COMPILE_STATUS,	GL_TRUE);
		verifyShaderParam	(m_testCtx, *this, shaderFrag,	GL_COMPILE_STATUS,	GL_TRUE);
		verifyProgramParam	(m_testCtx, *this, program,		GL_LINK_STATUS,		GL_TRUE);

		verifyProgramParam	(m_testCtx, *this, program,		GL_ACTIVE_UNIFORM_BLOCKS, 2);
		verifyProgramParam	(m_testCtx, *this, program,		GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, (GLint)std::string("longlongUniformBlockName").length() + 1); // including a null terminator
		expectError(GL_NO_ERROR);

		GLint longlongUniformBlockIndex	= glGetUniformBlockIndex(program, "longlongUniformBlockName");
		GLint shortUniformBlockIndex	= glGetUniformBlockIndex(program, "shortUniformBlockName");

		const char* uniformNames[] =
		{
			"longlongUniformBlockName.vector2",
			"shortUniformBlockName.vector2",
			"shortUniformBlockName.vector4"
		};

		// test UNIFORM_BLOCK_INDEX

		DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(uniformNames) == 3);

		StateQueryMemoryWriteGuard<GLuint[DE_LENGTH_OF_ARRAY(uniformNames)]> uniformIndices;
		StateQueryMemoryWriteGuard<GLint[DE_LENGTH_OF_ARRAY(uniformNames)]> uniformsBlockIndices;

		glGetUniformIndices(program, DE_LENGTH_OF_ARRAY(uniformNames), uniformNames, uniformIndices);
		uniformIndices.verifyValidity(m_testCtx);
		expectError(GL_NO_ERROR);

		glGetActiveUniformsiv(program, DE_LENGTH_OF_ARRAY(uniformNames), uniformIndices, GL_UNIFORM_BLOCK_INDEX, uniformsBlockIndices);
		uniformsBlockIndices.verifyValidity(m_testCtx);
		expectError(GL_NO_ERROR);

		if (uniformsBlockIndices[0] != longlongUniformBlockIndex ||
			uniformsBlockIndices[1] != shortUniformBlockIndex ||
			uniformsBlockIndices[2] != shortUniformBlockIndex)
		{
			m_testCtx.getLog() << TestLog::Message
				<< "// ERROR: Expected ["	<< longlongUniformBlockIndex	<< ", " << shortUniformBlockIndex	<< ", " << shortUniformBlockIndex	<< "];"
				<<	"got ["					<< uniformsBlockIndices[0]		<< ", " << uniformsBlockIndices[1]	<< ", " << uniformsBlockIndices[2]	<< "]" << TestLog::EndMessage;
			if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform block index");
		}

		// test UNIFORM_BLOCK_NAME_LENGTH

		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_NAME_LENGTH, (GLint)std::string("longlongUniformBlockName").length() + 1); // including null-terminator
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_NAME_LENGTH, (GLint)std::string("shortUniformBlockName").length() + 1); // including null-terminator
		expectError(GL_NO_ERROR);

		// test UNIFORM_BLOCK_REFERENCED_BY_VERTEX_SHADER & UNIFORM_BLOCK_REFERENCED_BY_FRAGMENT_SHADER

		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_VERTEX_SHADER,	GL_TRUE);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_FRAGMENT_SHADER,	GL_TRUE);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_VERTEX_SHADER,	GL_TRUE);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_FRAGMENT_SHADER,	GL_FALSE);
		expectError(GL_NO_ERROR);

		// test UNIFORM_BLOCK_ACTIVE_UNIFORMS

		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_ACTIVE_UNIFORMS,	1);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_ACTIVE_UNIFORMS,	2);
		expectError(GL_NO_ERROR);

		// test UNIFORM_BLOCK_ACTIVE_UNIFORM_INDICES

		{
			StateQueryMemoryWriteGuard<GLint> longlongUniformBlockUniforms;
			glGetActiveUniformBlockiv(program, longlongUniformBlockIndex, GL_UNIFORM_BLOCK_ACTIVE_UNIFORMS, &longlongUniformBlockUniforms);
			longlongUniformBlockUniforms.verifyValidity(m_testCtx);

			if (longlongUniformBlockUniforms == 2)
			{
				StateQueryMemoryWriteGuard<GLint[2]> longlongUniformBlockUniformIndices;
				glGetActiveUniformBlockiv(program, longlongUniformBlockIndex, GL_UNIFORM_BLOCK_ACTIVE_UNIFORM_INDICES, longlongUniformBlockUniformIndices);
				longlongUniformBlockUniformIndices.verifyValidity(m_testCtx);

				if ((GLuint(longlongUniformBlockUniformIndices[0]) != uniformIndices[0] || GLuint(longlongUniformBlockUniformIndices[1]) != uniformIndices[1]) &&
					(GLuint(longlongUniformBlockUniformIndices[1]) != uniformIndices[0] || GLuint(longlongUniformBlockUniformIndices[0]) != uniformIndices[1]))
				{
					m_testCtx.getLog() << TestLog::Message
						<< "// ERROR: Expected {"	<< uniformIndices[0]						<< ", " << uniformIndices[1] << "};"
						<<	"got {"					<< longlongUniformBlockUniformIndices[0]	<< ", " << longlongUniformBlockUniformIndices[1] << "}" << TestLog::EndMessage;

					if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform indices");
				}

			}
		}

		// check block names

		{
			char buffer[2048] = {'x'};
			GLint written = 0;
			glGetActiveUniformBlockName(program, longlongUniformBlockIndex, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);
			checkIntEquals(m_testCtx, written, (GLint)std::string("longlongUniformBlockName").length());

			written = 0;
			glGetActiveUniformBlockName(program, shortUniformBlockIndex, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);
			checkIntEquals(m_testCtx, written, (GLint)std::string("shortUniformBlockName").length());

			// and one with too small buffer
			written = 0;
			glGetActiveUniformBlockName(program, longlongUniformBlockIndex, 1, &written, buffer);
			checkIntEquals(m_testCtx, written, 0);
		}

		expectError(GL_NO_ERROR);
		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}